

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult cmCMakePresetsGraphInternal::PresetOptionalIntHelper(optional<int> *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  _func_ReadFileResult_int_ptr_Value_ptr *in_RCX;
  Value *value_local;
  optional<int> *out_local;
  
  if (PresetOptionalIntHelper(std::optional<int>&,Json::Value_const*)::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&PresetOptionalIntHelper(std::optional<int>&,Json::Value_const*)::
                                 helper);
    if (iVar1 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Optional<int,cmCMakePresetsGraph::ReadFileResult(*)(int&,Json::Value_const*)>
                (&PresetOptionalIntHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,0x558940,in_RCX);
      __cxa_atexit(std::
                   function<cmCMakePresetsGraph::ReadFileResult_(std::optional<int>_&,_const_Json::Value_*)>
                   ::~function,&PresetOptionalIntHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetOptionalIntHelper(std::optional<int>&,Json::Value_const*)::helper);
    }
  }
  RVar2 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::optional<int>_&,_const_Json::Value_*)>
          ::operator()(&PresetOptionalIntHelper::helper,out,value);
  return RVar2;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetOptionalIntHelper(
  cm::optional<int>& out, const Json::Value* value)
{
  static auto const helper =
    JSONHelperBuilder::Optional<int>(ReadFileResult::READ_OK, PresetIntHelper);

  return helper(out, value);
}